

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void most_hostile_types::
     test_interface_for<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,most_hostile_types::with_order_none::Ref,most_hostile_types::with_order_none::Rep,most_hostile_types::with_order_none::Store>,ak_toolkit::markable_ns::order_by_value>
               (void)

{
  representation_type local_34;
  int *local_30;
  value_type local_28;
  value_type local_24;
  representation_type local_20;
  Val val;
  Rep rep;
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  mh2;
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  mh1;
  
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::markable(&mh2);
  val.v = 1;
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::markable((markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
              *)&rep,&val);
  local_20.v = 2;
  local_24.v = 2;
  mh2._storage = _rep;
  local_28.v = 2;
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::assign(&mh2,&local_28);
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::assign(&mh2,&local_24);
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::has_value(&mh2);
  local_30 = (int *)ak_toolkit::markable_ns::
                    markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
                    ::value(&mh2);
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::representation_value(&mh2);
  local_34.v = 2;
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::assign_representation
            ((markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
              *)&rep,&local_34);
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::assign_representation
            ((markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
              *)&rep,&local_20);
  ak_toolkit::markable_ns::swap
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
                   *)&rep);
  return;
}

Assistant:

void test_interface_for()
  {
    using Rep = typename markable<MP, OP>::representation_type;
    using Val = typename markable<MP, OP>::value_type;

    markable<MP, OP> mh1, mh2{Val{1}};
    const Rep rep{2};
    const Val val{2};
    mh1 = mh2;
    mh1.assign(Val{2});
    mh1.assign(val);
    (void)mh1.has_value();
    (void)mh1.value();
    (void)mh1.representation_value();

    mh2.assign_representation(Rep{2});
    mh2.assign_representation(rep);

    swap(mh1, mh2);
  }